

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int size;
  string local_1c8 [32];
  undefined1 local_1a8 [64];
  undefined1 local_168 [8];
  Raytracer rt;
  int imgHeight;
  int imgWidth;
  string buffer;
  allocator local_31;
  string local_30 [8];
  string xml;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"example2.xml",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)&imgHeight);
  rt.lightsrc.super__Vector_base<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x200;
  rt.lightsrc.super__Vector_base<std::shared_ptr<Light>,_std::allocator<std::shared_ptr<Light>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x200;
  std::__cxx11::string::string((string *)(local_1a8 + 0x20),local_30);
  Raytracer::Raytracer((Raytracer *)local_168,(string *)(local_1a8 + 0x20));
  std::__cxx11::string::~string((string *)(local_1a8 + 0x20));
  Raytracer::start_abi_cxx11_((Raytracer *)local_1a8);
  std::__cxx11::string::operator=((string *)&imgHeight,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::string(local_1c8,(string *)&imgHeight);
  size = std::__cxx11::string::size();
  Raytracer::writePPM((Raytracer *)local_168,(string *)local_1c8,size);
  std::__cxx11::string::~string(local_1c8);
  Raytracer::~Raytracer((Raytracer *)local_168);
  std::__cxx11::string::~string((string *)&imgHeight);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
    std::string xml="example2.xml";
    std::string buffer;
    int imgWidth=512;
    int imgHeight=512;

    Raytracer rt(xml);

    buffer=rt.start();
    rt.writePPM(buffer, buffer.size());

    return 0;
}